

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool hashmap_eq(hashmap_entry_t *entry,char *data,size_t length)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  
  if ((entry->name).length != length) {
    return false;
  }
  sVar3 = 0;
  do {
    bVar4 = length == sVar3;
    if (bVar4) {
      return bVar4;
    }
    pcVar1 = data + sVar3;
    pcVar2 = (entry->name).data + sVar3;
    sVar3 = sVar3 + 1;
  } while (*pcVar1 == *pcVar2);
  return bVar4;
}

Assistant:

static bool hashmap_eq(const hashmap_entry_t* entry, const char* data, size_t length)
{
    const string_t* name = &entry->name;
    if(name->length != length)
        return false;
    for(size_t i = 0; i < length; i++) {
        if(data[i] != name->data[i]) {
            return false;
        }
    }

    return true;
}